

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O3

int xmlRelaxNGElementMatch
              (xmlRelaxNGValidCtxtPtr ctxt,xmlRelaxNGDefinePtr_conflict define,xmlNodePtr elem)

{
  xmlNs *pxVar1;
  xmlGenericErrorFunc p_Var2;
  int iVar3;
  int iVar4;
  xmlGenericErrorFunc *pp_Var5;
  void **ppvVar6;
  xmlChar *arg2;
  xmlChar *pxVar7;
  uint uVar8;
  xmlRelaxNGValidErr err;
  xmlRelaxNGDefinePtr pxVar9;
  
  if ((define->name != (xmlChar *)0x0) && (iVar3 = xmlStrEqual(elem->name,define->name), iVar3 == 0)
     ) {
    pxVar7 = define->name;
    arg2 = elem->name;
    err = XML_RELAXNG_ERR_ELEMNAME;
    goto LAB_00176477;
  }
  pxVar7 = define->ns;
  if (pxVar7 == (xmlChar *)0x0) {
    if ((elem->ns != (xmlNs *)0x0) && (pxVar7 = define->name, pxVar7 != (xmlChar *)0x0)) {
LAB_0017642d:
      err = XML_RELAXNG_ERR_ELEMEXTRANS;
LAB_00176475:
      arg2 = (xmlChar *)0x0;
LAB_00176477:
      xmlRelaxNGAddValidError(ctxt,err,pxVar7,arg2,0);
      return 0;
    }
  }
  else {
    pxVar1 = elem->ns;
    if (*pxVar7 == '\0') {
      if (pxVar1 != (xmlNs *)0x0) {
        pxVar7 = define->name;
        if (pxVar7 == (xmlChar *)0x0) {
          pxVar7 = elem->name;
        }
        goto LAB_0017642d;
      }
    }
    else {
      if (pxVar1 == (xmlNs *)0x0) {
        pxVar7 = elem->name;
        err = XML_RELAXNG_ERR_ELEMNONS;
        goto LAB_00176475;
      }
      iVar3 = xmlStrEqual(pxVar1->href,pxVar7);
      if (iVar3 == 0) {
        pxVar7 = elem->name;
        arg2 = define->ns;
        err = XML_RELAXNG_ERR_ELEMWRONGNS;
        goto LAB_00176477;
      }
    }
  }
  pxVar9 = define->nameClass;
  iVar3 = 1;
  if (pxVar9 == (xmlRelaxNGDefinePtr)0x0) {
    return 1;
  }
  if (pxVar9->type == XML_RELAXNG_CHOICE) {
    if (ctxt == (xmlRelaxNGValidCtxtPtr)0x0) {
      uVar8 = 0;
    }
    else {
      uVar8 = ctxt->flags;
      ctxt->flags = uVar8 | 1;
    }
    for (pxVar9 = pxVar9->nameClass; pxVar9 != (xmlRelaxNGDefinePtr_conflict)0x0;
        pxVar9 = pxVar9->next) {
      iVar4 = xmlRelaxNGElementMatch(ctxt,pxVar9,elem);
      if (iVar4 == 1) goto LAB_00176545;
      if (iVar4 < 0) goto LAB_0017653c;
    }
    iVar3 = 0;
    if (ctxt == (xmlRelaxNGValidCtxtPtr)0x0) {
      return 0;
    }
    if (0 < ctxt->errNr) {
      xmlRelaxNGPopErrors(ctxt,0);
    }
    goto LAB_0017654e;
  }
  if (pxVar9->type != XML_RELAXNG_EXCEPT) {
    pp_Var5 = __xmlGenericError();
    p_Var2 = *pp_Var5;
    ppvVar6 = __xmlGenericErrorContext();
    (*p_Var2)(*ppvVar6,"Unimplemented block at %s:%d\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/frida[P]libxml2/relaxng.c",
              0x2624);
    return -1;
  }
  if (ctxt == (xmlRelaxNGValidCtxtPtr)0x0) {
    uVar8 = 0;
  }
  else {
    uVar8 = ctxt->flags;
    ctxt->flags = uVar8 | 1;
  }
  for (pxVar9 = pxVar9->content; pxVar9 != (xmlRelaxNGDefinePtr_conflict)0x0; pxVar9 = pxVar9->next)
  {
    iVar4 = xmlRelaxNGElementMatch(ctxt,pxVar9,elem);
    if (iVar4 == 1) {
      iVar3 = 0;
      break;
    }
    if (iVar4 < 0) goto LAB_0017653c;
  }
LAB_00176545:
  if (ctxt == (xmlRelaxNGValidCtxtPtr)0x0) {
    return iVar3;
  }
LAB_0017654e:
  ctxt->flags = uVar8;
  return iVar3;
LAB_0017653c:
  iVar3 = -1;
  goto LAB_00176545;
}

Assistant:

static int
xmlRelaxNGElementMatch(xmlRelaxNGValidCtxtPtr ctxt,
                       xmlRelaxNGDefinePtr define, xmlNodePtr elem)
{
    int ret = 0, oldflags = 0;

    if (define->name != NULL) {
        if (!xmlStrEqual(elem->name, define->name)) {
            VALID_ERR3(XML_RELAXNG_ERR_ELEMNAME, define->name, elem->name);
            return (0);
        }
    }
    if ((define->ns != NULL) && (define->ns[0] != 0)) {
        if (elem->ns == NULL) {
            VALID_ERR2(XML_RELAXNG_ERR_ELEMNONS, elem->name);
            return (0);
        } else if (!xmlStrEqual(elem->ns->href, define->ns)) {
            VALID_ERR3(XML_RELAXNG_ERR_ELEMWRONGNS,
                       elem->name, define->ns);
            return (0);
        }
    } else if ((elem->ns != NULL) && (define->ns != NULL) &&
               (define->name == NULL)) {
        VALID_ERR2(XML_RELAXNG_ERR_ELEMEXTRANS, elem->name);
        return (0);
    } else if ((elem->ns != NULL) && (define->name != NULL)) {
        VALID_ERR2(XML_RELAXNG_ERR_ELEMEXTRANS, define->name);
        return (0);
    }

    if (define->nameClass == NULL)
        return (1);

    define = define->nameClass;
    if (define->type == XML_RELAXNG_EXCEPT) {
        xmlRelaxNGDefinePtr list;

        if (ctxt != NULL) {
            oldflags = ctxt->flags;
            ctxt->flags |= FLAGS_IGNORABLE;
        }

        list = define->content;
        while (list != NULL) {
            ret = xmlRelaxNGElementMatch(ctxt, list, elem);
            if (ret == 1) {
                if (ctxt != NULL)
                    ctxt->flags = oldflags;
                return (0);
            }
            if (ret < 0) {
                if (ctxt != NULL)
                    ctxt->flags = oldflags;
                return (ret);
            }
            list = list->next;
        }
        ret = 1;
        if (ctxt != NULL) {
            ctxt->flags = oldflags;
        }
    } else if (define->type == XML_RELAXNG_CHOICE) {
        xmlRelaxNGDefinePtr list;

        if (ctxt != NULL) {
            oldflags = ctxt->flags;
            ctxt->flags |= FLAGS_IGNORABLE;
        }

        list = define->nameClass;
        while (list != NULL) {
            ret = xmlRelaxNGElementMatch(ctxt, list, elem);
            if (ret == 1) {
                if (ctxt != NULL)
                    ctxt->flags = oldflags;
                return (1);
            }
            if (ret < 0) {
                if (ctxt != NULL)
                    ctxt->flags = oldflags;
                return (ret);
            }
            list = list->next;
        }
        if (ctxt != NULL) {
            if (ret != 0) {
                if ((ctxt->flags & FLAGS_IGNORABLE) == 0)
                    xmlRelaxNGDumpValidError(ctxt);
            } else {
                if (ctxt->errNr > 0)
                    xmlRelaxNGPopErrors(ctxt, 0);
            }
        }
        ret = 0;
        if (ctxt != NULL) {
            ctxt->flags = oldflags;
        }
    } else {
        TODO ret = -1;
    }
    return (ret);
}